

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_row_access_constructors<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>,std::map<unsigned_int,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>>>>>>
               (vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>_>
                *matrix,map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>_>_>_>_>
                        *rows)

{
  ID_index IVar1;
  pointer pIVar2;
  node_ptr plVar3;
  node_ptr plVar4;
  node_ptr *pplVar5;
  undefined4 uVar6;
  Index IVar7;
  bool bVar8;
  node_ptr to_insert;
  Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
  *__v;
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>>
  *this;
  long lVar9;
  _Rb_tree_node_base *p_Var10;
  const_node_ptr p;
  node_ptr plVar11;
  long *plVar12;
  undefined4 local_2ac;
  undefined *local_2a8;
  undefined4 *local_2a0;
  undefined **local_298;
  undefined **local_290;
  char *local_288;
  shared_count sStack_280;
  char *local_278;
  undefined **local_270;
  ulong local_268;
  shared_count sStack_260;
  undefined4 **local_258;
  Delete_disposer local_250;
  undefined1 local_248;
  undefined8 *local_240;
  undefined ***local_238;
  char *local_230;
  char *local_228;
  shared_count sStack_220;
  _Rb_tree_node_base *local_218;
  undefined4 **local_210;
  char *local_208;
  map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>_>_>_>_>
  *local_200;
  undefined1 local_1f8 [16];
  _Base_ptr p_Stack_1e8;
  Index local_1e0;
  _Base_ptr local_1d8;
  Entry_constructor *pEStack_1d0;
  list_node<void_*> local_1c8;
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>_>
  *local_1b8;
  undefined1 local_1b0 [24];
  undefined4 ***local_198;
  _Base_ptr local_190;
  Entry_constructor *pEStack_188;
  list_node<void_*> local_180;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_200 = rows;
  build_rows<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>
            ();
  get_ordered_rows<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_1b0,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)local_1f8,
             (vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_1b0);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)local_1b0);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_1f8);
  build_column_values<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>
            ();
  get_ordered_column_contents<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_1b0,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)local_1f8,
             (vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_1b0);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)local_1b0);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_1f8);
  pIVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_1f8._0_4_ = 6;
  local_1f8._8_8_ = local_200;
  p_Stack_1e8 = *(_Base_ptr *)&pIVar2->super_Column_dimension_option;
  local_1e0 = (pIVar2->super_Chain_column_option).pairedColumn_;
  local_1d8 = (_Base_ptr)pIVar2->operators_;
  pEStack_1d0 = pIVar2->entryPool_;
  plVar12 = *(long **)&(pIVar2->column_).super_type.data_.root_plus_size_;
  local_1c8.next_ = &local_1c8;
  local_1c8.prev_ = &local_1c8;
  local_1b8 = matrix;
  if ((Column_support *)plVar12 != &pIVar2->column_) {
    do {
      IVar1 = *(ID_index *)(plVar12 + 2);
      __v = (Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
             *)operator_new(0x20);
      (__v->super_Entry_column_index_option).columnIndex_ = local_1f8._0_4_;
      __v->rowIndex_ = IVar1;
      (__v->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ = local_1c8.prev_
      ;
      (__v->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = &local_1c8;
      pplVar5 = &(local_1c8.prev_)->next_;
      local_1c8.prev_ = (node_ptr)&__v->super_Column_hook;
      *pplVar5 = (node_ptr)&__v->super_Column_hook;
      local_1b0._0_4_ = IVar1;
      if ((map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>_>_>_>_>
           *)local_1f8._8_8_ !=
          (map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>_>_>_>_>
           *)0x0) {
        this = (_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>>
                *)std::
                  map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>_>_>_>_>
                  ::operator[]((map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>_>_>_>_>
                                *)local_1f8._8_8_,(key_type *)local_1b0);
        std::
        _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>>>
        ::
        _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false>>>const&>
                  (this,__v);
      }
      plVar12 = (long *)*plVar12;
    } while ((Column_support *)plVar12 != &pIVar2->column_);
  }
  p_Var10 = (local_200->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_218 = &(local_200->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var10 != local_218) {
    do {
      if (p_Var10[2]._M_left != (_Base_ptr)0x0) {
        lVar9 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&p_Var10[1]._M_left);
        if ((*(uint *)(lVar9 + 0x38) < 6) && ((0x2bU >> (*(uint *)(lVar9 + 0x38) & 0x1f) & 1) != 0))
        {
          local_120 = 
          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
          ;
          local_118 = "";
          local_130 = &boost::unit_test::basic_cstring<char_const>::null;
          local_128 = &boost::unit_test::basic_cstring<char_const>::null;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x20d,
                     &local_130);
          local_268 = local_268 & 0xffffffffffffff00;
          local_270 = &PTR__lazy_ostream_001db440;
          sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
          local_258 = (undefined4 **)0x1a71a4;
          local_2a0 = (undefined4 *)CONCAT44(local_2a0._4_4_,*(int *)(lVar9 + 0x20));
          local_2a8 = (undefined *)CONCAT44(local_2a8._4_4_,6);
          local_290 = (undefined **)CONCAT71(local_290._1_7_,*(int *)(lVar9 + 0x20) == 6);
          local_288 = (char *)0x0;
          sStack_280.pi_ = (sp_counted_base *)0x0;
          local_230 = 
          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
          ;
          local_228 = "";
          local_210 = &local_2a0;
          local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
          local_1b0._0_8_ = &PTR__lazy_ostream_001db900;
          local_1b0._16_8_ = &boost::unit_test::lazy_ostream::inst;
          local_198 = &local_210;
          local_298 = &local_2a8;
          local_248 = 0;
          local_250.col_ =
               (Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
                *)&PTR__lazy_ostream_001db940;
          local_240 = &boost::unit_test::lazy_ostream::inst;
          local_238 = &local_298;
          boost::test_tools::tt_detail::report_assertion
                    (&local_290,&local_270,&local_230,0x20d,1,2,2,"entry.get_column_index()",
                     local_1b0,"6",&local_250);
          boost::detail::shared_count::~shared_count(&sStack_280);
        }
      }
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
    } while (p_Var10 != local_218);
  }
  pEStack_188 = pEStack_1d0;
  local_190 = local_1d8;
  IVar7 = local_1e0;
  uVar6 = local_1f8._0_4_;
  local_1f8._0_4_ = 0;
  local_1b0._0_4_ = uVar6;
  local_1b0._8_8_ = local_1f8._8_8_;
  local_1b0._16_8_ = p_Stack_1e8;
  p_Stack_1e8 = (_Base_ptr)0xffffffffffffffff;
  local_1e0 = 0xffffffff;
  local_198 = (undefined4 ***)CONCAT44(local_198._4_4_,IVar7);
  local_1d8 = (_Base_ptr)0x0;
  pEStack_1d0 = (Entry_constructor *)0x0;
  local_180.next_ = &local_180;
  local_180.prev_ = &local_180;
  boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>::
  swap_nodes(&local_180,&local_1c8);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x21c);
  local_288 = (char *)((ulong)local_288 & 0xffffffffffffff00);
  local_290 = &PTR__lazy_ostream_001db440;
  sStack_280.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_2a8 = (undefined *)0xffffffffffffffff;
  plVar11 = &local_180;
  do {
    plVar11 = plVar11->next_;
    local_2a8 = local_2a8 + 1;
  } while (plVar11 != &local_180);
  local_298 = &local_2a8;
  local_2a0 = &local_2ac;
  local_2ac = 4;
  local_228 = (char *)0x0;
  sStack_220.pi_ = (sp_counted_base *)0x0;
  local_210 = (undefined4 **)0x1a789e;
  local_208 = "";
  local_238 = &local_298;
  local_248 = 0;
  local_250.col_ =
       (Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001db400;
  local_240 = &boost::unit_test::lazy_ostream::inst;
  local_258 = &local_2a0;
  local_268 = local_268 & 0xffffffffffffff00;
  local_270 = &PTR__lazy_ostream_001db940;
  sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_230._0_1_ = local_2a8 == (undefined *)0x4;
  boost::test_tools::tt_detail::report_assertion
            (&local_230,&local_290,&local_210,0x21c,1,2,2,"moveCol.size()",&local_250,"4",&local_270
            );
  boost::detail::shared_count::~shared_count(&sStack_220);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x21d);
  local_288 = (char *)((ulong)local_288 & 0xffffffffffffff00);
  local_290 = &PTR__lazy_ostream_001db440;
  sStack_280.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  lVar9 = 1;
  plVar11 = &local_1c8;
  do {
    plVar11 = plVar11->next_;
    lVar9 = lVar9 + -1;
  } while (plVar11 != &local_1c8);
  local_2a8 = (undefined *)-lVar9;
  local_2ac = 0;
  local_230 = (char *)CONCAT71(local_230._1_7_,lVar9 == 0);
  local_228 = (char *)0x0;
  sStack_220.pi_ = (sp_counted_base *)0x0;
  local_210 = (undefined4 **)0x1a789e;
  local_208 = "";
  local_298 = &local_2a8;
  local_248 = 0;
  local_250.col_ =
       (Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001db400;
  local_240 = &boost::unit_test::lazy_ostream::inst;
  local_238 = &local_298;
  local_2a0 = &local_2ac;
  local_268 = local_268 & 0xffffffffffffff00;
  local_270 = &PTR__lazy_ostream_001db940;
  sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_258 = &local_2a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_230,&local_290,&local_210,0x21d,1,2,2,"col.size()",&local_250,"0",&local_270);
  boost::detail::shared_count::~shared_count(&sStack_220);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x21e);
  bVar8 = Gudhi::persistence_matrix::operator==
                    ((local_1b8->
                     super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
                      *)local_1b0);
  local_270 = (undefined **)CONCAT71(local_270._1_7_,bVar8);
  local_268 = 0;
  sStack_260.pi_ = (sp_counted_base *)0x0;
  local_290 = (undefined **)0x1b1974;
  local_288 = "";
  local_248 = 0;
  local_250.col_ =
       (Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001db3b0;
  local_240 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_238 = &local_290;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_260);
  p_Var10 = (local_200->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var10 != local_218) {
    do {
      if (p_Var10[2]._M_left != (_Base_ptr)0x0) {
        lVar9 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&p_Var10[1]._M_left);
        if ((*(uint *)(lVar9 + 0x38) < 6) && ((0x2bU >> (*(uint *)(lVar9 + 0x38) & 0x1f) & 1) != 0))
        {
          local_140 = 
          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
          ;
          local_138 = "";
          local_150 = &boost::unit_test::basic_cstring<char_const>::null;
          local_148 = &boost::unit_test::basic_cstring<char_const>::null;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x225,
                     &local_150);
          local_288 = (char *)((ulong)local_288 & 0xffffffffffffff00);
          local_290 = &PTR__lazy_ostream_001db440;
          sStack_280.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
          local_278 = "";
          local_2a8 = (undefined *)CONCAT44(local_2a8._4_4_,*(int *)(lVar9 + 0x20));
          local_2ac = 6;
          local_230 = (char *)CONCAT71(local_230._1_7_,*(int *)(lVar9 + 0x20) == 6);
          local_228 = (char *)0x0;
          sStack_220.pi_ = (sp_counted_base *)0x0;
          local_210 = (undefined4 **)0x1a789e;
          local_208 = "";
          local_298 = &local_2a8;
          local_248 = 0;
          local_250.col_ =
               (Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
                *)&PTR__lazy_ostream_001db900;
          local_240 = &boost::unit_test::lazy_ostream::inst;
          local_238 = &local_298;
          local_2a0 = &local_2ac;
          local_268 = local_268 & 0xffffffffffffff00;
          local_270 = &PTR__lazy_ostream_001db940;
          sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
          local_258 = &local_2a0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_230,&local_290,&local_210,0x225,1,2,2,"entry.get_column_index()",
                     &local_250,"6",&local_270);
          boost::detail::shared_count::~shared_count(&sStack_220);
        }
      }
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
    } while (p_Var10 != local_218);
  }
  Gudhi::persistence_matrix::swap
            ((Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
              *)local_1f8,
             (Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
              *)local_1b0);
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x234);
  local_288 = (char *)((ulong)local_288 & 0xffffffffffffff00);
  local_290 = &PTR__lazy_ostream_001db440;
  sStack_280.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  lVar9 = 1;
  plVar11 = &local_180;
  do {
    plVar11 = plVar11->next_;
    lVar9 = lVar9 + -1;
  } while (plVar11 != &local_180);
  local_2a8 = (undefined *)-lVar9;
  local_2ac = 0;
  local_228 = (char *)0x0;
  sStack_220.pi_ = (sp_counted_base *)0x0;
  local_210 = (undefined4 **)0x1a789e;
  local_208 = "";
  local_298 = &local_2a8;
  local_248 = 0;
  local_250.col_ =
       (Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001db400;
  local_240 = &boost::unit_test::lazy_ostream::inst;
  local_238 = &local_298;
  local_2a0 = &local_2ac;
  local_268 = local_268 & 0xffffffffffffff00;
  local_270 = &PTR__lazy_ostream_001db940;
  sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_258 = &local_2a0;
  local_230._0_1_ = lVar9 == 0;
  boost::test_tools::tt_detail::report_assertion
            (&local_230,&local_290,&local_210,0x234,1,2,2,"moveCol.size()",&local_250,"0",&local_270
            );
  boost::detail::shared_count::~shared_count(&sStack_220);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x235);
  local_288 = (char *)((ulong)local_288 & 0xffffffffffffff00);
  local_290 = &PTR__lazy_ostream_001db440;
  sStack_280.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_2a8 = (undefined *)0xffffffffffffffff;
  plVar11 = &local_1c8;
  do {
    plVar11 = plVar11->next_;
    local_2a8 = local_2a8 + 1;
  } while (plVar11 != &local_1c8);
  local_2ac = 4;
  local_230 = (char *)CONCAT71(local_230._1_7_,local_2a8 == (undefined *)0x4);
  local_228 = (char *)0x0;
  sStack_220.pi_ = (sp_counted_base *)0x0;
  local_210 = (undefined4 **)0x1a789e;
  local_208 = "";
  local_298 = &local_2a8;
  local_248 = 0;
  local_250.col_ =
       (Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001db400;
  local_240 = &boost::unit_test::lazy_ostream::inst;
  local_238 = &local_298;
  local_2a0 = &local_2ac;
  local_268 = local_268 & 0xffffffffffffff00;
  local_270 = &PTR__lazy_ostream_001db940;
  sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_258 = &local_2a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_230,&local_290,&local_210,0x235,1,2,2,"col.size()",&local_250,"4",&local_270);
  boost::detail::shared_count::~shared_count(&sStack_220);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x236);
  bVar8 = Gudhi::persistence_matrix::operator==
                    ((local_1b8->
                     super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
                      *)local_1f8);
  local_270 = (undefined **)CONCAT71(local_270._1_7_,bVar8);
  local_268 = 0;
  sStack_260.pi_ = (sp_counted_base *)0x0;
  local_290 = (undefined **)0x1b1989;
  local_288 = "";
  local_248 = 0;
  local_250.col_ =
       (Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001db3b0;
  local_240 = &boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_238 = &local_290;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_260);
  p_Var10 = (local_200->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var10 != local_218) {
    do {
      if (p_Var10[2]._M_left != (_Base_ptr)0x0) {
        lVar9 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&p_Var10[1]._M_left);
        if ((*(uint *)(lVar9 + 0x38) < 6) && ((0x2bU >> (*(uint *)(lVar9 + 0x38) & 0x1f) & 1) != 0))
        {
          local_160 = 
          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
          ;
          local_158 = "";
          local_170 = &boost::unit_test::basic_cstring<char_const>::null;
          local_168 = &boost::unit_test::basic_cstring<char_const>::null;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x23d,
                     &local_170);
          local_288 = (char *)((ulong)local_288 & 0xffffffffffffff00);
          local_290 = &PTR__lazy_ostream_001db440;
          sStack_280.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
          local_278 = "";
          local_2a8 = (undefined *)CONCAT44(local_2a8._4_4_,*(int *)(lVar9 + 0x20));
          local_2ac = 6;
          local_230 = (char *)CONCAT71(local_230._1_7_,*(int *)(lVar9 + 0x20) == 6);
          local_228 = (char *)0x0;
          sStack_220.pi_ = (sp_counted_base *)0x0;
          local_210 = (undefined4 **)0x1a789e;
          local_208 = "";
          local_298 = &local_2a8;
          local_248 = 0;
          local_250.col_ =
               (Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
                *)&PTR__lazy_ostream_001db900;
          local_240 = &boost::unit_test::lazy_ostream::inst;
          local_238 = &local_298;
          local_2a0 = &local_2ac;
          local_268 = local_268 & 0xffffffffffffff00;
          local_270 = &PTR__lazy_ostream_001db940;
          sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
          local_258 = &local_2a0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_230,&local_290,&local_210,0x23d,1,2,2,"entry.get_column_index()",
                     &local_250,"6",&local_270);
          boost::detail::shared_count::~shared_count(&sStack_220);
        }
      }
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
    } while (p_Var10 != local_218);
  }
  local_250.col_ =
       (Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
        *)local_1b0;
  if (local_180.next_ != &local_180) {
    plVar11 = local_180.next_;
    do {
      plVar3 = plVar11->next_;
      plVar11->next_ = (node_ptr)0x0;
      plVar11->prev_ = (node_ptr)0x0;
      Gudhi::persistence_matrix::
      Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
      ::Delete_disposer::operator()(&local_250,(Entry *)&plVar11[-1].prev_);
      plVar11 = plVar3;
    } while (plVar3 != &local_180);
  }
  local_1b0._0_8_ = local_1f8;
  if (local_1c8.next_ != &local_1c8) {
    plVar11 = local_1c8.next_;
    do {
      plVar4 = (((type *)&plVar11->next_)->super_type).super_list_node<void_*>.next_;
      plVar11->next_ = (node_ptr)0x0;
      plVar11->prev_ = (node_ptr)0x0;
      Gudhi::persistence_matrix::
      Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false>_>_>
      ::Delete_disposer::operator()((Delete_disposer *)local_1b0,(Entry *)&plVar11[-1].prev_);
      plVar11 = plVar4;
    } while (plVar4 != &local_1c8);
  }
  return;
}

Assistant:

void column_test_row_access_constructors(std::vector<Column>& matrix, Row_container& rows) {
  test_matrix_equality<Column>(build_rows<Column>(), get_ordered_rows(matrix));
  test_matrix_equality<Column>(build_column_values<Column>(), get_ordered_column_contents(matrix));

  Column col(matrix[0], 6, &rows);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  Column moveCol(std::move(col));
  BOOST_CHECK_EQUAL(moveCol.size(), 4);
  BOOST_CHECK_EQUAL(col.size(), 0);
  BOOST_CHECK(matrix[0] == moveCol);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  swap(col, moveCol);
  BOOST_CHECK_EQUAL(moveCol.size(), 0);
  BOOST_CHECK_EQUAL(col.size(), 4);
  BOOST_CHECK(matrix[0] == col);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }
}